

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O2

json_bool lh_table_lookup_ex(lh_table *t,void *k,void **v)

{
  json_bool jVar1;
  lh_entry *plVar2;
  void *pvVar3;
  
  plVar2 = lh_table_lookup_entry(t,k);
  if (plVar2 == (lh_entry *)0x0) {
    jVar1 = 0;
    if (v == (void **)0x0) {
      return 0;
    }
    pvVar3 = (void *)0x0;
  }
  else {
    if (v == (void **)0x0) {
      return 1;
    }
    pvVar3 = plVar2->v;
    jVar1 = 1;
  }
  *v = pvVar3;
  return jVar1;
}

Assistant:

json_bool lh_table_lookup_ex(struct lh_table *t, const void *k, void **v)
{
	struct lh_entry *e = lh_table_lookup_entry(t, k);
	if (e != NULL)
	{
		if (v != NULL)
			*v = lh_entry_v(e);
		return 1; /* key found */
	}
	if (v != NULL)
		*v = NULL;
	return 0; /* key not found */
}